

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emmy_debugger_manager.cpp
# Opt level: O2

void __thiscall EmmyDebuggerManager::EmmyDebuggerManager(EmmyDebuggerManager *this)

{
  _Rb_tree_header *p_Var1;
  
  std::make_shared<HookStateBreak>();
  std::make_shared<HookStateStepOver>();
  std::make_shared<HookStateStepIn>();
  std::make_shared<HookStateStepOut>();
  std::make_shared<HookStateContinue>();
  std::make_shared<HookStateStop>();
  (this->helperCode)._M_dataplus._M_p = (pointer)&(this->helperCode).field_2;
  (this->helperCode)._M_string_length = 0;
  (this->helperCode).field_2._M_local_buf[0] = '\0';
  (this->extNames).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->extNames).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->extNames).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ExtensionPoint::ExtensionPoint(&this->extension);
  *(undefined8 *)((long)&(this->debuggerMtx).super___mutex_base._M_mutex + 0x10) = 0;
  (this->debuggerMtx).super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  (this->debuggerMtx).super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->debuggerMtx).super___mutex_base._M_mutex + 8) = 0;
  (this->debuggerMtx).super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  p_Var1 = &(this->debuggers)._M_t._M_impl.super__Rb_tree_header;
  (this->debuggers)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->debuggers)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->debuggers)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->debuggers)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->lineSet)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->lineSet)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  p_Var1 = &(this->lineSet)._M_t._M_impl.super__Rb_tree_header;
  (this->debuggers)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->breakDebuggerMtx).super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->breakDebuggerMtx).super___mutex_base._M_mutex + 8) = 0;
  *(undefined8 *)((long)&(this->breakDebuggerMtx).super___mutex_base._M_mutex + 0x10) = 0;
  (this->breakDebuggerMtx).super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  (this->breakDebuggerMtx).super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  (this->hitDebugger).super___shared_ptr<Debugger,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->hitDebugger).super___shared_ptr<Debugger,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->breakpointsMtx).super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->breakpointsMtx).super___mutex_base._M_mutex + 8) = 0;
  *(undefined8 *)((long)&(this->breakpointsMtx).super___mutex_base._M_mutex + 0x10) = 0;
  (this->breakpointsMtx).super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  (this->breakpointsMtx).super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  (this->breakpoints).
  super__Vector_base<std::shared_ptr<BreakPoint>,_std::allocator<std::shared_ptr<BreakPoint>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->breakpoints).
  super__Vector_base<std::shared_ptr<BreakPoint>,_std::allocator<std::shared_ptr<BreakPoint>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->breakpoints).
  super__Vector_base<std::shared_ptr<BreakPoint>,_std::allocator<std::shared_ptr<BreakPoint>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->lineSet)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->lineSet)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->lineSet)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->isRunning)._M_base._M_i = false;
  return;
}

Assistant:

EmmyDebuggerManager::EmmyDebuggerManager()
	: stateBreak(std::make_shared<HookStateBreak>()),
      stateStepOver(std::make_shared<HookStateStepOver>()),
      stateStepIn(std::make_shared<HookStateStepIn>()),
      stateStepOut(std::make_shared<HookStateStepOut>()),
	  stateContinue(std::make_shared<HookStateContinue>()),
	  stateStop(std::make_shared<HookStateStop>()),

	  isRunning(false)
{
}